

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int wb_consume(archive_write *a,size_t size)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  pvVar1 = a->format_data;
  uVar5 = *(ulong *)((long)pvVar1 + 0x102e0);
  if (uVar5 < size || uVar5 == 0) {
    archive_set_error(&a->archive,-1,
                      "Internal Programing error: iso9660:wb_consume() size=%jd, wbuff_remaining=%jd"
                      ,size,uVar5,uVar5 != 0,pvVar1);
    return -0x1e;
  }
  *(ulong *)((long)pvVar1 + 0x102e0) = uVar5 - size;
  if (0x7ff < uVar5 - size) {
    return 0;
  }
  pvVar2 = a->format_data;
  lVar3 = *(long *)((long)pvVar2 + 0x102e0);
  uVar6 = -lVar3 + 0x10000;
  uVar5 = (ulong)((uint)uVar6 & 0x7ff);
  pvVar1 = (void *)((long)pvVar2 + 0x2dc);
  uVar6 = uVar6 & 0xfffffffffffff800;
  if (*(int *)((long)pvVar2 + 0x102e8) == 0) {
    iVar4 = __archive_write_output(a,pvVar1,uVar6);
  }
  else {
    iVar4 = write_to_temp(a,pvVar1,uVar6);
  }
  lVar7 = uVar6 + *(long *)((long)pvVar2 + 0x102f0);
  *(long *)((long)pvVar2 + 0x102f0) = lVar7;
  if (*(long *)((long)pvVar2 + 0x102f8) < lVar7) {
    *(long *)((long)pvVar2 + 0x102f8) = lVar7;
  }
  *(undefined8 *)((long)pvVar2 + 0x102e0) = 0x10000;
  if (uVar5 != 0) {
    *(ulong *)((long)pvVar2 + 0x102e0) = 0x10000 - uVar5;
    memmove(pvVar1,(void *)((long)pvVar2 + ((-lVar3 + 0x102dc) - uVar5)),uVar5);
  }
  return iVar4;
}

Assistant:

static int
wb_consume(struct archive_write *a, size_t size)
{
	struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;

	if (size > iso9660->wbuff_remaining ||
	    iso9660->wbuff_remaining == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal Programing error: iso9660:wb_consume()"
		    " size=%jd, wbuff_remaining=%jd",
		    (intmax_t)size, (intmax_t)iso9660->wbuff_remaining);
		return (ARCHIVE_FATAL);
	}
	iso9660->wbuff_remaining -= size;
	if (iso9660->wbuff_remaining < LOGICAL_BLOCK_SIZE)
		return (wb_write_out(a));
	return (ARCHIVE_OK);
}